

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void InitOrLoadWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  ImGuiViewport *settings_00;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiViewport *main_viewport;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar1;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  settings_00 = ImGui::GetMainViewport();
  ImVec2::ImVec2(&local_28,60.0,60.0);
  local_20 = operator+((ImVec2 *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       (ImVec2 *)0x20243f);
  in_RDI->Pos = local_20;
  ImVec2::ImVec2(&local_30,0.0,0.0);
  in_RDI->SizeFull = local_30;
  in_RDI->Size = in_RDI->SizeFull;
  *(uint *)&in_RDI->field_0xf0 = *(uint *)&in_RDI->field_0xf0 & 0xff00ffff | 0xf0000;
  *(uint *)&in_RDI->field_0xf0 = *(uint *)&in_RDI->field_0xf0 & 0xffff00ff | 0xf00;
  *(uint *)&in_RDI->field_0xf0 = *(uint *)&in_RDI->field_0xf0 & 0xffffff00 | 0xf;
  if (in_RSI != (ImGuiWindow *)0x0) {
    SetWindowConditionAllowFlags(in_RDI,4,false);
    ApplyWindowSettings(in_RSI,(ImGuiWindowSettings *)settings_00);
  }
  (in_RDI->DC).IdealMaxPos = in_RDI->Pos;
  (in_RDI->DC).CursorMaxPos = (in_RDI->DC).IdealMaxPos;
  (in_RDI->DC).CursorStartPos = (in_RDI->DC).CursorMaxPos;
  if ((in_RDI->Flags & 0x40U) == 0) {
    if ((in_RDI->Size).x <= 0.0) {
      in_RDI->AutoFitFramesX = '\x02';
    }
    if ((in_RDI->Size).y <= 0.0) {
      in_RDI->AutoFitFramesY = '\x02';
    }
    bVar1 = true;
    if (in_RDI->AutoFitFramesX < '\x01') {
      bVar1 = '\0' < in_RDI->AutoFitFramesY;
    }
    in_RDI->AutoFitOnlyGrows = bVar1;
  }
  else {
    in_RDI->AutoFitFramesY = '\x02';
    in_RDI->AutoFitFramesX = '\x02';
    in_RDI->AutoFitOnlyGrows = false;
  }
  return;
}

Assistant:

static void InitOrLoadWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    // Initial window state with e.g. default/arbitrary window position
    // Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->Pos = main_viewport->Pos + ImVec2(60, 60);
    window->Size = window->SizeFull = ImVec2(0, 0);
    window->SetWindowPosAllowFlags = window->SetWindowSizeAllowFlags = window->SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;

    if (settings != NULL)
    {
        SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
        ApplyWindowSettings(window, settings);
    }
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->DC.IdealMaxPos = window->Pos; // So first call to CalcWindowContentSizes() doesn't return crazy values

    if ((window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }
}